

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdf-c.cc
# Opt level: O1

QPDF_ERROR_CODE qpdf_create_from_json_data(qpdf_data qpdf,char *buffer,unsigned_long_long size)

{
  QPDF_ERROR_CODE QVar1;
  Buffer *this;
  uchar *buf;
  shared_ptr<BufferInputSource> is;
  Buffer *b;
  bool local_5a;
  undefined1 local_59;
  BufferInputSource *local_58;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_50;
  _Any_data local_48;
  code *local_38;
  code *pcStack_30;
  Buffer *local_28;
  
  qpdf->filename = "json buffer";
  qpdf->buffer = buffer;
  qpdf->size = size;
  this = (Buffer *)operator_new(8);
  buf = QUtil::unsigned_char_pointer(buffer);
  Buffer::Buffer(this,buf,size);
  local_5a = true;
  local_58 = (BufferInputSource *)0x0;
  local_28 = this;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<BufferInputSource,std::allocator<BufferInputSource>,char_const*&,Buffer*&,bool>
            (&local_50,&local_58,(allocator<BufferInputSource> *)&local_59,&qpdf->filename,&local_28
             ,&local_5a);
  local_48._8_8_ = 0;
  pcStack_30 = std::
               _Function_handler<void_(_qpdf_data_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf-c.cc:1912:32)>
               ::_M_invoke;
  local_38 = std::
             _Function_handler<void_(_qpdf_data_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf-c.cc:1912:32)>
             ::_M_manager;
  local_48._M_unused._M_object = &local_58;
  QVar1 = trap_errors(qpdf,(function<void_(_qpdf_data_*)> *)&local_48);
  if (local_38 != (code *)0x0) {
    (*local_38)(&local_48,&local_48,__destroy_functor);
  }
  if (local_50._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_50._M_pi);
  }
  return QVar1;
}

Assistant:

QPDF_ERROR_CODE
qpdf_create_from_json_data(qpdf_data qpdf, char const* buffer, unsigned long long size)
{
    QPDF_ERROR_CODE status = QPDF_SUCCESS;
    qpdf->filename = "json buffer";
    qpdf->buffer = buffer;
    qpdf->size = size;
    auto b = new Buffer(QUtil::unsigned_char_pointer(buffer), QIntC::to_size(size));
    auto is = std::make_shared<BufferInputSource>(qpdf->filename, b, true);
    status = trap_errors(qpdf, [&is](qpdf_data q) { q->qpdf->createFromJSON(is); });
    return status;
}